

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O3

void Zyx_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  ulong *puVar1;
  uint uVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  word *pwVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Zyx_Man_t *p;
  Bmc_EsPar_t *pBVar11;
  uint uVar12;
  long lVar13;
  timespec *pTruth_00;
  int (*paiVar14) [32];
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  timespec ts_2;
  word pTruth [16];
  uint local_130;
  int local_12c;
  long local_120;
  timespec local_118;
  long local_108;
  long local_e8;
  ulong local_e0;
  uint local_d4;
  long local_d0;
  int (*local_c8) [32];
  int (*local_c0) [32];
  timespec local_b8 [8];
  
  iVar8 = clock_gettime(3,local_b8);
  lVar20 = -1;
  local_120 = -1;
  if (-1 < iVar8) {
    local_120 = local_b8[0].tv_nsec / 1000 +
                CONCAT71(local_b8[0].tv_sec._1_7_,(byte)local_b8[0].tv_sec) * 1000000;
  }
  iVar8 = clock_gettime(3,local_b8);
  if (-1 < iVar8) {
    lVar20 = local_b8[0].tv_nsec / 1000 +
             CONCAT71(local_b8[0].tv_sec._1_7_,(byte)local_b8[0].tv_sec) * 1000000;
  }
  if (pPars->fMajority == 0) {
    Abc_TtReadHex((word *)local_b8,pPars->pTtStr);
    local_12c = 0;
    iVar8 = pPars->nVars;
    if (((byte)local_b8[0].tv_sec & 1) != 0) {
      uVar21 = 1 << ((char)iVar8 - 6U & 0x1f);
      local_12c = 1;
      if (iVar8 < 7) {
        uVar21 = 1;
      }
      if (0 < (int)uVar21) {
        uVar15 = 0;
        do {
          (&local_b8[0].tv_sec)[uVar15] = ~(&local_b8[0].tv_sec)[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar21 != uVar15);
      }
    }
  }
  else {
    iVar8 = pPars->nVars;
    local_12c = 0;
  }
  if (10 < iVar8) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x4f8,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  local_e8 = lVar20;
  if (6 < pPars->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x4f9,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  pTruth_00 = local_b8;
  if (pPars->fMajority != 0) {
    pTruth_00 = (timespec *)0x0;
  }
  p = Zyx_ManAlloc(pPars,(word *)pTruth_00);
  pBVar11 = p->pPars;
  printf("Running exact synthesis for %d-input function with %d %d-input %s...\n",
         (ulong)(uint)pBVar11->nVars,(ulong)(uint)pBVar11->nNodes,(ulong)(uint)pBVar11->nLutSize);
  local_c8 = p->pFanins;
  uVar21 = 0;
  local_e0 = 0;
  uVar15 = 0;
  local_130 = 0;
  do {
    while( true ) {
      iVar19 = (int)uVar15;
      iVar8 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if (iVar8 != 1) break;
      iVar8 = Zyx_ManAddCnfLazyTopo(p);
      if (iVar8 == 0) goto LAB_00584bc7;
      if (iVar8 == -1) {
        puts("Became UNSAT after adding lazy constraints.");
LAB_00585348:
        if (pPars->fVerbose != 0) {
          iVar8 = clock_gettime(3,&local_118);
          if (iVar8 < 0) {
            lVar20 = -1;
          }
          else {
            lVar20 = local_118.tv_nsec / 1000 +
                     CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
          }
          local_118.tv_sec._0_4_ = iVar19;
          printf("Iter %6d : ",(ulong)local_130);
          Extra_PrintBinary(_stdout,(uint *)&local_118,p->pPars->nVars);
          printf("  ");
          uVar10 = bmcg_sat_solver_clausenum(p->pSat);
          printf("Cla =%9d  ",(ulong)uVar10);
          printf("Lazy =%6d  ",(ulong)uVar21);
          uVar21 = bmcg_sat_solver_conflictnum(p->pSat);
          iVar8 = 0x9c2b4a;
          printf("Conf =%9d  ",(ulong)uVar21);
          Abc_Print(iVar8,"%s =","Time");
          Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar20 - local_120) / 1000000.0);
        }
        if (pPars->fEnumSols == 0) {
          if (iVar19 == -1) {
            Zyx_ManPrintSolution(p,local_12c,1);
          }
          else {
            puts("The problem has no solution.");
          }
        }
        else {
          printf("Finished enumerating %d solutions.\n",local_e0);
        }
        printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p->nUsed[1],(ulong)(uint)p->nUsed[0]);
        iVar19 = 3;
        iVar8 = clock_gettime(3,&local_118);
        if (iVar8 < 0) {
          lVar20 = -1;
        }
        else {
          lVar20 = local_118.tv_nsec / 1000 +
                   CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
        }
        Abc_Print(iVar19,"%s =","Total runtime");
        Abc_Print(iVar19,"%9.2f sec\n",(double)(lVar20 - local_120) / 1000000.0);
        Zyx_ManFree(p);
        return;
      }
      uVar21 = uVar21 + iVar8;
    }
    if (iVar8 == -1) goto LAB_00585348;
LAB_00584bc7:
    pBVar11 = p->pPars;
    lVar20 = (long)pBVar11->nVars;
    iVar8 = p->nObjs;
    if (pBVar11->nVars < iVar8) {
      paiVar14 = local_c8 + lVar20;
      local_d4 = uVar21;
      do {
        iVar8 = (int)lVar20;
        uVar21 = Zyx_ManCollectFanins(p,iVar8);
        pBVar11 = p->pPars;
        if (uVar21 != pBVar11->nLutSize) {
          __assert_fail("nFanins == p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0x4b5,"int Zyx_ManEval(Zyx_Man_t *)");
        }
        uVar10 = p->nWords;
        pVVar3 = p->vInfo;
        if (0 < (int)uVar21) {
          uVar15 = 0;
          do {
            uVar17 = (*paiVar14)[uVar15] * uVar10;
            if (((int)uVar17 < 0) || (pVVar3->nSize <= (int)uVar17)) goto LAB_00585576;
            (&local_118.tv_sec)[uVar15] = (__time_t)(pVVar3->pArray + uVar17);
            uVar15 = uVar15 + 1;
          } while (uVar21 != uVar15);
        }
        uVar21 = uVar10 * iVar8;
        local_c0 = paiVar14;
        if (pBVar11->fMajority == 0) {
          if (((int)uVar21 < 0) || (pVVar3->nSize <= (int)uVar21)) goto LAB_00585576;
          if (0 < (int)uVar10) {
            memset(pVVar3->pArray + uVar21,0,(ulong)uVar10 << 3);
          }
          iVar8 = p->LutMask;
          if (0 < iVar8) {
            uVar21 = 1;
            local_d0 = lVar20;
            do {
              iVar8 = bmcg_sat_solver_read_cex_varvalue
                                (p->pSat,((int)lVar20 - p->pPars->nVars) * (iVar8 + 1) + uVar21);
              if (iVar8 != 0) {
                uVar10 = p->nWords;
                uVar15 = (ulong)uVar10;
                uVar17 = p->nObjs * uVar10;
                if ((int)uVar17 < 0) goto LAB_00585576;
                iVar8 = p->vInfo->nSize;
                if (iVar8 <= (int)uVar17) goto LAB_00585576;
                pwVar5 = p->vInfo->pArray;
                pwVar4 = pwVar5 + uVar17;
                if (0 < (int)uVar10) {
                  memset(pwVar4,0xff,uVar15 * 8);
                }
                lVar20 = (long)p->pPars->nLutSize;
                if (0 < lVar20) {
                  lVar13 = 0;
                  do {
                    lVar6 = (&local_118.tv_sec)[lVar13];
                    if ((uVar21 >> ((uint)lVar13 & 0x1f) & 1) == 0) {
                      if (0 < (int)uVar10) {
                        uVar16 = 0;
                        do {
                          pwVar4[uVar16] = pwVar4[uVar16] & ~*(ulong *)(lVar6 + uVar16 * 8);
                          uVar16 = uVar16 + 1;
                        } while (uVar15 != uVar16);
                      }
                    }
                    else if (0 < (int)uVar10) {
                      uVar16 = 0;
                      do {
                        pwVar4[uVar16] = pwVar4[uVar16] & *(ulong *)(lVar6 + uVar16 * 8);
                        uVar16 = uVar16 + 1;
                      } while (uVar15 != uVar16);
                    }
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != lVar20);
                }
                if (((int)(uVar10 * (int)local_d0) < 0) || (iVar8 <= (int)(uVar10 * (int)local_d0)))
                goto LAB_00585576;
                lVar20 = local_d0;
                if (0 < (int)uVar10) {
                  uVar16 = 0;
                  do {
                    puVar1 = pwVar5 + (int)local_d0 * uVar10 + uVar16;
                    *puVar1 = *puVar1 | pwVar4[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar15 != uVar16);
                }
              }
              iVar8 = p->LutMask;
              bVar22 = (int)uVar21 < iVar8;
              uVar21 = uVar21 + 1;
            } while (bVar22);
          }
        }
        else {
          if (((int)uVar21 < 0) || (pVVar3->nSize <= (int)uVar21)) goto LAB_00585576;
          if (0 < (int)uVar10) {
            pwVar4 = pVVar3->pArray;
            uVar15 = 0;
            do {
              uVar16 = *(ulong *)(local_118.tv_nsec + uVar15 * 8);
              uVar18 = *(ulong *)(local_108 + uVar15 * 8);
              pwVar4[uVar10 * iVar8 + uVar15] =
                   uVar18 & uVar16 |
                   (uVar18 | uVar16) &
                   *(ulong *)(CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) + uVar15 * 8);
              uVar15 = uVar15 + 1;
            } while (uVar10 != uVar15);
          }
        }
        lVar20 = lVar20 + 1;
        iVar8 = p->nObjs;
        paiVar14 = local_c0 + 1;
      } while (lVar20 < iVar8);
      pBVar11 = p->pPars;
      uVar21 = local_d4;
    }
    if (pBVar11->fMajority == 0) {
      uVar10 = (iVar8 + -1) * p->nWords;
      if (((int)uVar10 < 0) || (p->vInfo->nSize <= (int)uVar10)) goto LAB_00585576;
      bVar7 = (byte)pBVar11->nVars;
      uVar17 = 1 << (bVar7 - 6 & 0x1f);
      if (pBVar11->nVars < 7) {
        uVar17 = 1;
      }
      uVar15 = 0xffffffff;
      if (0 < (int)uVar17) {
        iVar8 = 0;
        uVar16 = 0;
        do {
          uVar18 = p->vInfo->pArray[uVar10 + uVar16];
          if (uVar18 != p->pTruth[uVar16]) {
            uVar18 = p->pTruth[uVar16] ^ uVar18;
            bVar22 = (int)uVar18 == 0;
            uVar15 = uVar18 >> 0x20;
            if (!bVar22) {
              uVar15 = uVar18;
            }
            iVar9 = (uint)bVar22 * 0x20;
            iVar19 = iVar9 + 0x10;
            uVar16 = uVar15 >> 0x10;
            if ((short)uVar15 != 0) {
              iVar19 = iVar9;
              uVar16 = uVar15;
            }
            iVar9 = iVar19 + 8;
            uVar15 = uVar16 >> 8;
            if ((char)uVar16 != '\0') {
              iVar9 = iVar19;
              uVar15 = uVar16;
            }
            iVar19 = iVar9 + 4;
            uVar16 = uVar15 >> 4;
            if ((uVar15 & 0xf) != 0) {
              iVar19 = iVar9;
              uVar16 = uVar15;
            }
            uVar10 = (uint)(uVar16 >> 2) & 0x3fffffff;
            iVar9 = iVar19 + 2;
            if ((uVar16 & 3) != 0) {
              uVar10 = (uint)uVar16;
              iVar9 = iVar19;
            }
            uVar15 = (ulong)(((~uVar10 & 1) + iVar9) - iVar8);
            break;
          }
          uVar16 = uVar16 + 1;
          iVar8 = iVar8 + -0x40;
        } while (uVar17 != uVar16);
      }
      if (1 << (bVar7 & 0x1f) <= (int)uVar15) {
        __assert_fail("iMint < (1 << p->pPars->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0x4d7,"int Zyx_ManEval(Zyx_Man_t *)");
      }
LAB_00584fc1:
      iVar19 = (int)uVar15;
      if (iVar19 == -1) goto LAB_00584fe6;
      if (pPars->fUseIncr == 0) {
        iVar8 = Zyx_ManAddCnfLazyFunc(p,iVar19);
      }
      else {
        iVar8 = Zyx_ManAddCnfLazyFunc2(p,iVar19);
      }
      if (iVar8 == 0) {
        printf("Became UNSAT after adding constraints for minterm %d\n",uVar15);
        goto LAB_00585348;
      }
      iVar8 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if ((pPars->fVerbose != 0) &&
         ((pPars->fUseIncr == 0 || (local_130 == (local_130 / 100) * 100)))) {
        iVar9 = clock_gettime(3,&local_118);
        lVar20 = -1;
        if (-1 < iVar9) {
          lVar20 = local_118.tv_nsec / 1000 +
                   CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
        }
        lVar20 = lVar20 - local_e8;
        local_118.tv_sec._0_4_ = iVar19;
        printf("Iter %6d : ",(ulong)local_130);
        Extra_PrintBinary(_stdout,(uint *)&local_118,p->pPars->nVars);
        printf("  ");
        uVar10 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%9d  ",(ulong)uVar10);
        printf("Lazy =%6d  ",(ulong)uVar21);
        uVar10 = bmcg_sat_solver_conflictnum(p->pSat);
        iVar9 = 0x9c2b4a;
        printf("Conf =%9d  ",(ulong)uVar10);
        Abc_Print(iVar9,"%s =","Time");
        Abc_Print(iVar9,"%9.2f sec\n",(double)lVar20 / 1000000.0);
        iVar9 = clock_gettime(3,&local_118);
        local_e8 = -1;
        if (-1 < iVar9) {
          local_e8 = local_118.tv_nsec / 1000 +
                     CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
        }
      }
      if (iVar8 == -1) goto LAB_00585348;
    }
    else {
      uVar10 = p->nWords * iVar8;
      if ((int)uVar10 < 0) {
LAB_00585576:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar17 = p->vInfo->nSize;
      if ((int)uVar17 <= (int)uVar10) goto LAB_00585576;
      uVar2 = p->vMidMints->nSize;
      if (0 < (int)uVar2) {
        uVar12 = p->nWords * (iVar8 + -1);
        if (((int)uVar12 < 0) || (uVar17 <= uVar12)) goto LAB_00585576;
        pwVar4 = p->vInfo->pArray;
        uVar16 = 0;
        do {
          uVar17 = p->vMidMints->pArray[uVar16];
          uVar15 = (ulong)uVar17;
          lVar20 = (long)((int)uVar17 >> 6);
          if (((pwVar4[(ulong)uVar12 + lVar20] ^ pwVar4[(ulong)uVar10 + lVar20]) >> (uVar15 & 0x3f)
              & 1) != 0) goto LAB_00584fc1;
          uVar16 = uVar16 + 1;
        } while (uVar2 != uVar16);
      }
LAB_00584fe6:
      if (pPars->fEnumSols == 0) {
        iVar19 = -1;
        goto LAB_00585348;
      }
      if (pPars->fVerbose != 0) {
        iVar8 = clock_gettime(3,&local_118);
        lVar20 = -1;
        if (-1 < iVar8) {
          lVar20 = local_118.tv_nsec / 1000 +
                   CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
        }
        local_118.tv_sec._0_4_ = -1;
        printf("Iter %6d : ",(ulong)local_130);
        Extra_PrintBinary(_stdout,(uint *)&local_118,p->pPars->nVars);
        printf("  ");
        uVar10 = bmcg_sat_solver_clausenum(p->pSat);
        printf("Cla =%9d  ",(ulong)uVar10);
        printf("Lazy =%6d  ",(ulong)uVar21);
        uVar10 = bmcg_sat_solver_conflictnum(p->pSat);
        iVar8 = 0x9c2b4a;
        printf("Conf =%9d  ",(ulong)uVar10);
        Abc_Print(iVar8,"%s =","Time");
        Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar20 - local_120) / 1000000.0);
        iVar8 = clock_gettime(3,&local_118);
        local_e8 = -1;
        if (-1 < iVar8) {
          local_e8 = local_118.tv_nsec / 1000 +
                     CONCAT44(local_118.tv_sec._4_4_,(int)local_118.tv_sec) * 1000000;
        }
      }
      iVar8 = (int)local_e0;
      Zyx_ManPrintSolution(p,local_12c,(uint)(iVar8 == 0));
      iVar9 = Zyx_ManAddCnfBlockSolution(p);
      uVar15 = 0xffffffff;
      iVar19 = -1;
      local_e0 = (ulong)(iVar8 + 1);
      if (iVar9 == 0) goto LAB_00585348;
    }
    local_130 = local_130 + 1;
  } while( true );
}

Assistant:

void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int status, Iter, iMint = 0, fCompl = 0, nLazyAll = 0, nSols = 0;
    abctime clkTotal = Abc_Clock(), clk = Abc_Clock();  Zyx_Man_t * p; 
    word pTruth[16]; 
    if ( !pPars->fMajority )
    {
        Abc_TtReadHex( pTruth, pPars->pTtStr );
        if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, Abc_TtWordNum(pPars->nVars) ); }
    }
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Zyx_ManAlloc( pPars, pPars->fMajority ? NULL : pTruth );
    printf( "Running exact synthesis for %d-input function with %d %d-input %s...\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( Iter = 0 ; ; Iter++ )
    {
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            int nLazy = Zyx_ManAddCnfLazyTopo( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( status == GLUCOSE_UNSAT )
            break;
        // find mismatch
        iMint = Zyx_ManEval( p );
        if ( iMint == -1 )
        {
            if ( pPars->fEnumSols )
            {
                nSols++;
                if ( pPars->fVerbose )
                {
                    Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
                    clk = Abc_Clock();
                }
                Zyx_ManPrintSolution( p, fCompl, nSols==1 );
                if ( !Zyx_ManAddCnfBlockSolution( p ) )
                {
                    status = GLUCOSE_UNSAT;
                    break;
                }
                continue;
            }
            else
                break;
        }
        if ( pPars->fUseIncr ? !Zyx_ManAddCnfLazyFunc2(p, iMint) : !Zyx_ManAddCnfLazyFunc(p, iMint) )
        {
            printf( "Became UNSAT after adding constraints for minterm %d\n", iMint );
            status = GLUCOSE_UNSAT;
            break;
        }
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || Iter % 100 == 0) )
        {
            Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clk );
            clk = Abc_Clock();
        }
        if ( status == GLUCOSE_UNSAT )
            break;
    }
    if ( pPars->fVerbose )
        Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
    if ( pPars->fEnumSols )
        printf( "Finished enumerating %d solutions.\n", nSols );
    else if ( iMint == -1 )
        Zyx_ManPrintSolution( p, fCompl, 1 );
    else
        printf( "The problem has no solution.\n" );
    //Zyx_ManEvalStats( p );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    Zyx_ManFree( p );
}